

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Tags::SimpleTag::Parse(SimpleTag *this,IMkvReader *pReader,longlong pos,longlong size)

{
  long lVar1;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong size_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  SimpleTag *this_local;
  
  id = pos + size;
  stop = size;
  size_local = pos;
  pos_local = (longlong)pReader;
  pReader_local = (IMkvReader *)this;
  do {
    do {
      if (id <= size_local) {
        if (size_local != id) {
          return -2;
        }
        return 0;
      }
      lVar1 = ParseElementHeader((IMkvReader *)pos_local,&size_local,id,&size_1,&status);
      if (lVar1 < 0) {
        return lVar1;
      }
    } while (status == 0);
    if (size_1 == 0x45a3) {
      lVar1 = UnserializeString((IMkvReader *)pos_local,size_local,status,&this->m_tag_name);
joined_r0x0012e886:
      if (lVar1 != 0) {
        return lVar1;
      }
    }
    else if (size_1 == 0x4487) {
      lVar1 = UnserializeString((IMkvReader *)pos_local,size_local,status,&this->m_tag_string);
      goto joined_r0x0012e886;
    }
    size_local = status + size_local;
    if (id < size_local) {
      return -2;
    }
  } while( true );
}

Assistant:

long Tags::SimpleTag::Parse(IMkvReader* pReader, long long pos,
                            long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTagName) {
      status = UnserializeString(pReader, pos, size, m_tag_name);

      if (status)
        return status;
    } else if (id == libwebm::kMkvTagString) {
      status = UnserializeString(pReader, pos, size, m_tag_string);

      if (status)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}